

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,uint64 value,uint64 fixed_size)

{
  bool bVar1;
  int32 iVar2;
  uint64 local_38;
  uint64 size;
  uint64 fixed_size_local;
  uint64 value_local;
  uint64 type_local;
  IMkvWriter *writer_local;
  
  if (writer == (IMkvWriter *)0x0) {
    writer_local._7_1_ = false;
  }
  else {
    iVar2 = WriteID(writer,type);
    if (iVar2 == 0) {
      iVar2 = GetUIntSize(value);
      local_38 = (uint64)iVar2;
      if ((fixed_size == 0) || (bVar1 = local_38 <= fixed_size, local_38 = fixed_size, bVar1)) {
        iVar2 = WriteUInt(writer,local_38);
        if (iVar2 == 0) {
          iVar2 = SerializeInt(writer,value,(int32)local_38);
          if (iVar2 == 0) {
            writer_local._7_1_ = true;
          }
          else {
            writer_local._7_1_ = false;
          }
        }
        else {
          writer_local._7_1_ = false;
        }
      }
      else {
        writer_local._7_1_ = false;
      }
    }
    else {
      writer_local._7_1_ = false;
    }
  }
  return writer_local._7_1_;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, uint64 value,
                      uint64 fixed_size) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  uint64 size = GetUIntSize(value);
  if (fixed_size > 0) {
    if (size > fixed_size)
      return false;
    size = fixed_size;
  }
  if (WriteUInt(writer, size))
    return false;

  if (SerializeInt(writer, value, static_cast<int32>(size)))
    return false;

  return true;
}